

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O3

int formula(char *expr,rpf_t **rpf,variables_t *variable)

{
  ulong uVar1;
  byte bVar2;
  void *pvVar3;
  bool bVar4;
  long lVar5;
  operation_t *poVar6;
  char cVar7;
  ushort **ppuVar8;
  ulong uVar9;
  size_t sVar10;
  byte *pbVar11;
  undefined8 *puVar12;
  void *pvVar13;
  rpf_type_t *prVar14;
  double *pdVar15;
  ulong uVar16;
  rpf_t *prVar17;
  rpf_t *prVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  variables_t *pvVar22;
  byte *pbVar23;
  char *__s1;
  int in_R8D;
  operation_t *__s;
  rpf_type_t rVar24;
  rpf_type_t rVar25;
  ushort *puVar26;
  byte *pbVar27;
  double dVar28;
  int sp_op;
  rpf_t *rpf2;
  stack_t num [256];
  stack_t op [256];
  int local_2168;
  uint local_2164;
  ushort **local_2160;
  variables_t *local_2158;
  long local_2150;
  rpf_t **local_2148;
  variables_t *local_2140;
  rpf_t local_2138 [10];
  stack_t local_2038 [255];
  stack_t local_1048;
  stack_t local_1038 [256];
  
  *rpf = (rpf_t *)0x0;
  lVar21 = 0;
  local_2168 = 0;
  local_2164 = 0;
  local_2140 = variable + 1;
  local_2148 = rpf;
LAB_0010278e:
  bVar2 = *expr;
  uVar9 = (ulong)bVar2;
  if (bVar2 < 0x29) {
    if (bVar2 == 0x28) {
      ppuVar8 = __ctype_b_loc();
      pbVar23 = (byte *)expr;
      do {
        expr = (char *)pbVar23;
        uVar9 = (ulong)*expr;
        pbVar23 = (byte *)expr + 1;
      } while ((*(byte *)((long)*ppuVar8 + uVar9 * 2 + 1) & 0x20) != 0);
      iVar19 = 0;
      do {
        cVar7 = (char)uVar9;
        if (cVar7 == '(') {
          iVar19 = iVar19 + 1;
          if (iVar19 == 0) goto LAB_001028b0;
        }
        else {
          if ((uVar9 & 0xff) == 0) goto LAB_00102df7;
          iVar19 = iVar19 - (uint)(cVar7 == ')');
          if (iVar19 == 0) goto LAB_001028a8;
        }
        uVar9 = (ulong)((byte *)expr)[1];
        expr = (char *)((byte *)expr + 1);
      } while( true );
    }
    if (bVar2 == 0) goto LAB_00102e0d;
LAB_00102833:
    local_2150 = lVar21;
    ppuVar8 = __ctype_b_loc();
    puVar26 = *ppuVar8;
    uVar20 = (uint)puVar26[(char)bVar2];
    lVar21 = 0;
    if ((puVar26[(char)bVar2] >> 0xd & 1) == 0) {
      local_2158 = variable;
      if (operation[0].type == TYPE_MAX) {
LAB_00102c97:
        variable = local_2158;
        iVar19 = local_2168;
        if ((uVar20 >> 10 & 1) == 0) {
          pbVar23 = (byte *)expr;
          if ((char)uVar9 != '\0') {
            lVar21 = 0;
            do {
              cVar7 = (char)uVar9;
              if ((*(byte *)((long)puVar26 + (long)cVar7 * 2 + 1) & 8) == 0) {
                if ((cVar7 != '.') && (lVar21 != 0 || cVar7 != '-')) break;
              }
              lVar5 = lVar21 + 1;
              uVar9 = (ulong)((byte *)expr)[lVar5];
              lVar21 = lVar21 + 1;
            } while (((byte *)expr)[lVar5] != 0);
            pbVar23 = (byte *)expr + lVar21;
          }
          lVar21 = (long)local_2168;
          local_2038[lVar21].rank = 0;
          local_2038[lVar21].type = TYPE_VALUE;
          pdVar15 = (double *)malloc(8);
          local_2038[lVar21].value = pdVar15;
          dVar28 = strtod(expr,(char **)0x0);
          lVar21 = 0;
          *pdVar15 = dVar28;
          local_2168 = iVar19 + 1;
          expr = (char *)(pbVar23 + -1);
          variable = local_2158;
          goto LAB_00102de6;
        }
        if (local_2158 == (variables_t *)0x0) goto LAB_00102df7;
        uVar16 = 0;
        if ((char)uVar9 != '\0') {
          do {
            if (((puVar26[(char)uVar9] & 8) == 0) &&
               ((uVar20 = ((uint)uVar9 & 0xff) - 0x5b, uVar1 = uVar16, 4 < uVar20 ||
                ((0x15U >> (uVar20 & 0x1f) & 1) == 0)))) goto LAB_00102d8b;
            uVar1 = uVar16 + 1;
            *(char *)((long)&local_2138[0].type + uVar16) = (char)uVar9;
            lVar21 = uVar16 + 1;
            uVar9 = (ulong)((byte *)expr)[lVar21];
            uVar16 = uVar1;
          } while (((byte *)expr)[lVar21] != 0);
          uVar16 = uVar1 & 0xffffffff;
LAB_00102d8b:
          expr = (char *)((byte *)expr + uVar1);
          uVar16 = uVar16 & 0xffffffff;
        }
        *(undefined1 *)((long)&local_2138[0].type + uVar16) = 0;
        __s1 = local_2158->name;
        pvVar22 = local_2140;
        while( true ) {
          if (__s1 == (char *)0x0) goto LAB_00102df7;
          iVar19 = strcmp(__s1,(char *)local_2138);
          if (iVar19 == 0) break;
          __s1 = pvVar22->name;
          pvVar22 = pvVar22 + 1;
        }
        lVar21 = (long)local_2168;
        local_2168 = local_2168 + 1;
        local_2038[lVar21].rank = 0;
        local_2038[lVar21].type = TYPE_VARIABLE;
        local_2038[lVar21].value = pvVar22[-1].pointer;
        expr = (char *)((byte *)expr + -1);
        goto LAB_00102de4;
      }
      __s = operation;
      local_2160 = ppuVar8;
LAB_00102877:
      sVar10 = strlen(__s->op);
      iVar19 = strncmp(expr,__s->op,sVar10);
      if (iVar19 != 0) goto code_r0x00102891;
      if (0 < (long)(int)local_2164) {
        uVar20 = local_2164 - 1;
        if (local_1038[uVar20].rank == __s->rank) {
          local_2138[0].type = TYPE_MATH;
          prVar17 = formula_output(local_2038,&local_2168,&local_1048 + (int)local_2164,
                                   (int *)local_2138,in_R8D);
          local_2164 = uVar20;
        }
        else {
          if (local_1038[uVar20].rank <= __s->rank) goto LAB_00102981;
          prVar17 = formula_output(local_2038,&local_2168,local_1038,(int *)&local_2164,in_R8D);
        }
        if (prVar17 == (rpf_t *)0x0) goto LAB_00102df7;
      }
LAB_00102981:
      sVar10 = strlen(__s->op);
      iVar19 = local_2168;
      pbVar11 = (byte *)expr + sVar10;
      pbVar23 = (byte *)expr + sVar10;
      do {
        pbVar27 = pbVar23;
        pbVar11 = pbVar11 + 1;
        pbVar23 = pbVar27 + 1;
      } while ((*(byte *)((long)*local_2160 + (long)(char)*pbVar27 * 2 + 1) & 0x20) != 0);
      lVar21 = (long)local_2168;
      if ((lVar21 == 0) && (__s->func == math_sub)) {
        local_2038[0].rank = 0;
        local_2038[0].type = TYPE_VALUE;
        local_2038[0].value = malloc(8);
        *(undefined8 *)local_2038[0].value = 0xbff0000000000000;
        local_2168 = 1;
        local_1038[(int)local_2164].rank = operation[0xb].rank;
        local_1038[(int)local_2164].type = operation[0xb].type;
        local_1038[(int)local_2164].value = (void *)0x106270;
        rVar24 = __s->type;
LAB_00102b7b:
        local_2164 = local_2164 + 1;
        lVar21 = 0;
        rVar25 = rVar24;
LAB_00102c7b:
        expr = (char *)(pbVar27 + -1);
        variable = local_2158;
        if (rVar25 == TYPE_MAX) {
          puVar26 = *local_2160;
          uVar9 = (ulong)*expr;
          uVar20 = (uint)puVar26[uVar9];
          goto LAB_00102c97;
        }
        goto LAB_00102de6;
      }
      rVar24 = __s->type;
      if ((int)local_2150 != 1) {
        lVar21 = 1;
        uVar9 = (ulong)local_2164;
        if (rVar24 == TYPE_MATH) goto LAB_00102a8e;
LAB_00102c46:
        iVar19 = (int)uVar9;
        local_1038[iVar19].rank = __s->rank;
        local_1038[iVar19].type = rVar24;
        local_1038[iVar19].value = __s;
        local_2164 = iVar19 + 1;
        rVar25 = rVar24;
        goto LAB_00102c7b;
      }
      if (rVar24 == TYPE_MATH) {
LAB_00102a8e:
        lVar21 = (long)(int)local_2164;
        local_1038[lVar21].rank = __s->rank;
        local_1038[lVar21].type = TYPE_MATH;
        local_1038[lVar21].value = __s;
        local_2164 = local_2164 + 1;
        rVar25 = TYPE_MATH;
        if (__s->narg < 1) {
          lVar21 = 0;
          goto LAB_00102c7b;
        }
        iVar19 = 0;
        while( true ) {
          bVar2 = pbVar11[-1];
          if (bVar2 != 0x28) {
            if (bVar2 != 0) {
              iVar19 = iVar19 - (uint)(bVar2 == 0x29);
              if (iVar19 != 0) goto LAB_00102afa;
              if (bVar2 != 0) break;
            }
            goto LAB_00102df7;
          }
          iVar19 = iVar19 + 1;
          if (iVar19 == 0) break;
LAB_00102afa:
          pbVar11 = pbVar11 + 1;
        }
        iVar19 = formula((char *)(pbVar27 + 1),(rpf_t **)local_2138,local_2158);
        if ((iVar19 != 0) &&
           (pvVar3 = (void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type), pvVar3 != (void *)0x0
           )) {
          local_2150 = (long)local_2168;
          local_2038[local_2150].rank = 0;
          local_2038[local_2150].type = TYPE_RPF;
          local_2038[local_2150].value = pvVar3;
          do {
            pvVar13 = pvVar3;
            pvVar3 = *(void **)((long)pvVar13 + 0x10);
          } while (pvVar3 != (void *)0x0);
          uVar9 = (long)(int)local_2164 - 1;
          prVar14 = (rpf_type_t *)malloc(0x18);
          *(rpf_type_t **)((long)pvVar13 + 0x10) = prVar14;
          *prVar14 = local_1038[uVar9].type;
          *(void **)(prVar14 + 2) = local_1038[uVar9].value;
          prVar14[4] = TYPE_VALUE;
          prVar14[5] = TYPE_VALUE;
          local_2164 = (uint)uVar9;
          local_2168 = (int)local_2150 + 1;
          rVar24 = __s->type;
          lVar21 = 0;
          pbVar27 = pbVar11;
          rVar25 = TYPE_MATH;
          if (rVar24 != TYPE_MATH) goto LAB_00102c46;
          goto LAB_00102c7b;
        }
      }
      else if (__s->func == math_sub) {
        local_2038[lVar21].rank = 0;
        local_2038[lVar21].type = TYPE_VALUE;
        puVar12 = (undefined8 *)malloc(8);
        local_2038[lVar21].value = puVar12;
        *puVar12 = 0xbff0000000000000;
        local_2168 = iVar19 + 1;
        local_1038[(int)local_2164].rank = operation[0xb].rank;
        local_1038[(int)local_2164].type = operation[0xb].type;
        local_1038[(int)local_2164].value = (void *)0x106270;
        goto LAB_00102b7b;
      }
      goto LAB_00102df7;
    }
    goto LAB_00102de6;
  }
  if (bVar2 == 0x2c) {
    prVar17 = formula_output(local_2038,&local_2168,local_1038,(int *)&local_2164,in_R8D);
    lVar21 = 0;
    if (prVar17 != (rpf_t *)0x0) goto LAB_00102de6;
  }
  else {
    if (bVar2 != 0x29) goto LAB_00102833;
LAB_00102e0d:
    prVar17 = formula_output(local_2038,&local_2168,local_1038,(int *)&local_2164,in_R8D);
    lVar21 = 0;
    if (((prVar17 != (rpf_t *)0x0) && (-1 < local_2168)) && (local_2164 == 0)) {
      if (local_2168 != 0) {
        uVar9 = (ulong)(local_2168 - 1);
        prVar17 = local_2138;
        do {
          rVar24 = local_2038[uVar9].type;
          if (rVar24 == TYPE_RPF) {
            prVar17->next = (rpf_t *)local_2038[uVar9].value;
            do {
              prVar18 = prVar17;
              prVar17 = prVar18->next;
            } while (prVar18->next != (rpf_t *)0x0);
          }
          else {
            prVar18 = (rpf_t *)malloc(0x18);
            prVar17->next = prVar18;
            prVar18->type = rVar24;
            prVar18->value = local_2038[uVar9].value;
            prVar18->next = (rpf_t *)0x0;
          }
          bVar4 = 0 < (long)uVar9;
          uVar9 = uVar9 - 1;
          prVar17 = prVar18;
        } while (bVar4);
      }
      *local_2148 = local_2138[0].next;
      lVar21 = 1;
    }
  }
  goto LAB_00102df9;
code_r0x00102891:
  poVar6 = __s + 1;
  __s = __s + 1;
  if (poVar6->type == TYPE_MAX) goto LAB_00102c97;
  goto LAB_00102877;
LAB_001028a8:
  if (cVar7 != '\0') {
LAB_001028b0:
    iVar19 = formula((char *)pbVar23,(rpf_t **)local_2138,variable);
    if (iVar19 != 0) {
      if ((void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type) != (void *)0x0) {
        lVar21 = (long)local_2168;
        local_2168 = local_2168 + 1;
        local_2038[lVar21].rank = 0;
        local_2038[lVar21].type = TYPE_RPF;
        local_2038[lVar21].value = (void *)CONCAT44(local_2138[0]._4_4_,local_2138[0].type);
      }
LAB_00102de4:
      lVar21 = 0;
LAB_00102de6:
      expr = (char *)((byte *)expr + 1);
      goto LAB_0010278e;
    }
  }
LAB_00102df7:
  lVar21 = 0;
LAB_00102df9:
  return (int)lVar21;
}

Assistant:

int formula(const char *expr, struct rpf_t **rpf, const struct variables_t *variable)
{
  int i;
  struct stack_t op[256];
  struct stack_t num[256];
  int sp_op, sp_num;
  struct rpf_t rpf_start;
  struct rpf_t *rpf_tmp;
  *rpf = NULL;
  int op_cont;

  sp_num = 0;
  sp_op = 0;
  op_cont = 0;
  for (; *expr; expr++)
  {
    //printf( "[o%d/n%d] %s\n", sp_op, sp_num, expr );
    if (*expr == '(')
    {
      const char *end;
      int rank2;
      struct rpf_t *rpf2;

      rank2 = 0;
      for (; isspace(*expr); expr++)
        ;
      for (end = expr; *end; end++)
      {
        if (*end == '(')
          rank2++;
        if (*end == ')')
          rank2--;
        if (rank2 == 0)
          break;
      }
      if (rank2 || !(*end))
        return 0;
      if (formula(expr + 1, &rpf2, variable) == 0)
        return 0;
      if (rpf2)
      {
        num[sp_num].rank = 0;
        num[sp_num].type = TYPE_RPF;
        num[sp_num].value = rpf2;
        sp_num++;
      }

      expr = end;
      op_cont = 0;
      continue;
    }
    else if (*expr == ')')
    {
      op_cont = 0;
      break;
    }
    else if (*expr == ',')
    {
      if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
        return 0;
      op_cont = 0;
      continue;
    }
    else if (isspace(*expr))
    {
      op_cont = 0;
      continue;
    }
    for (i = 0; operation[i].type != TYPE_MAX; i++)
    {
      if (strstr(expr, operation[i].op) == expr)
      {
        if (sp_op > 0 && op[sp_op - 1].rank == operation[i].rank)
        {
          int sp_op2;
          sp_op2 = 1;
          if (formula_output(num, &sp_num, op + sp_op - 1, &sp_op2, operation[i].rank) == NULL)
            return 0;
          sp_op--;
        }
        else if (sp_op > 0 && op[sp_op - 1].rank > operation[i].rank)
        {
          if (formula_output(num, &sp_num, op, &sp_op, operation[i].rank) == NULL)
            return 0;
        }
        expr += strlen(operation[i].op);
        for (; isspace(*expr); expr++)
          ;

        if (sp_num == 0 && operation[i].func == math_sub)
        {
          // Case: start with -
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VALUE;
          num[sp_num].value = malloc(sizeof(double));
          *((double *)num[sp_num].value) = -1;
          sp_num++;
          op[sp_op].rank = operation[OPERATION_MUL].rank;
          op[sp_op].type = operation[OPERATION_MUL].type;
          op[sp_op].value = &operation[OPERATION_MUL];
          sp_op++;
          op_cont = 0;
          expr--;
          break;
        }
        else if (op_cont == 1 && operation[i].type != TYPE_MATH)
        {
          if (operation[i].func == math_sub)
          {
            // Case: x*-y
            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_VALUE;
            num[sp_num].value = malloc(sizeof(double));
            *((double *)num[sp_num].value) = -1;
            sp_num++;
            op[sp_op].rank = operation[OPERATION_MUL].rank;
            op[sp_op].type = operation[OPERATION_MUL].type;
            op[sp_op].value = &operation[OPERATION_MUL];
            sp_op++;
            op_cont = 0;
            expr--;
            break;
          }
          else
          {
            // Case: x*/y (Error)
            return 0;
          }
        }

        if (operation[i].type != TYPE_MATH)
        {
          op_cont = 1;
        }
        else
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
          op_cont = 0;
          if (operation[i].narg > 0)
          {
            const char *end;
            int rank2;
            struct rpf_t *rpf2;

            rank2 = 0;

            for (end = expr; *end; end++)
            {
              if (*end == '(')
                rank2++;
              if (*end == ')')
                rank2--;
              if (rank2 == 0)
                break;
            }
            if (rank2 || !(*end))
              return 0;
            if (formula(expr + 1, &rpf2, variable) == 0)
              return 0;
            if (!rpf2)
              return 0;

            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_RPF;
            num[sp_num].value = rpf2;
            rpf_push(rpf_last(rpf2), &op[sp_op - 1]);
            sp_op--;
            sp_num++;
            expr = end + 1;
          }
        }
        if (operation[i].type != TYPE_MATH)
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
        }
        expr--;

        break;
      }
    }
    if (operation[i].type != TYPE_MAX)
      continue;
    op_cont = 0;
    if (isalpha(*expr))
    {
      const char *end;
      char variable_name[256];
      int i;

      if (!variable)
        return 0;

      i = 0;
      for (end = expr; *end; end++)
      {
        if (!(isalnum(*end) || *end == '_' || *end == '[' || *end == ']'))
          break;
        variable_name[i++] = *end;
      }
      variable_name[i] = 0;

      for (i = 0; variable[i].name; i++)
      {
        if (strcmp(variable[i].name, variable_name) == 0)
        {
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VARIABLE;
          num[sp_num].value = variable[i].pointer;
          sp_num++;
          break;
        }
      }
      if (!variable[i].name)
        return 0;
      expr = end - 1;
    }
    else
    {
      const char *end;

      for (end = expr; *end; end++)
      {
        if (!(isdigit(*end) || (end == expr && *end == '-') || *end == '.'))
          break;
      }
      num[sp_num].rank = 0;
      num[sp_num].type = TYPE_VALUE;
      num[sp_num].value = malloc(sizeof(double));
      *((double *)num[sp_num].value) = strtod(expr, NULL);
      sp_num++;
      expr = end - 1;
    }
  }
  if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
    return 0;
  if (sp_num < 0 || sp_op != 0)
    return 0;

  rpf_start.type = TYPE_START;
  rpf_tmp = &rpf_start;
  for (sp_num--; sp_num >= 0; sp_num--)
  {
    switch (num[sp_num].type)
    {
      case TYPE_RPF:
        rpf_tmp = rpf_join(rpf_tmp, num[sp_num].value);
        break;
      default:
        rpf_tmp = rpf_push(rpf_tmp, &num[sp_num]);
        break;
    }
  }
  *rpf = rpf_start.next;
  return 1;
}